

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall
Catch::Generators::RandomFloatingGenerator<long_double>::next
          (RandomFloatingGenerator<long_double> *this)

{
  long in_RDI;
  uniform_real_distribution<long_double> *this_00;
  unkbyte10 in_ST0;
  SimplePcg32 *in_stack_ffffffffffffffd8;
  
  this_00 = (uniform_real_distribution<long_double> *)(in_RDI + 0x30);
  Catch::Detail::unique_ptr<Catch::Generators::RandomFloatingGenerator<long_double>::PImpl>::
  operator->((unique_ptr<Catch::Generators::RandomFloatingGenerator<long_double>::PImpl> *)this_00);
  Catch::Detail::unique_ptr<Catch::Generators::RandomFloatingGenerator<long_double>::PImpl>::
  operator->((unique_ptr<Catch::Generators::RandomFloatingGenerator<long_double>::PImpl> *)this_00);
  std::uniform_real_distribution<long_double>::operator()(this_00,in_stack_ffffffffffffffd8);
  *(unkbyte10 *)(in_RDI + 0x40) = in_ST0;
  return true;
}

Assistant:

bool RandomFloatingGenerator<long double>::next() {
            m_current_number = m_pimpl->dist( m_pimpl->rng );
            return true;
        }